

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O1

ParamGenerator<(anonymous_namespace)::QuantParam>
testing::ValuesIn<(anonymous_namespace)::QuantParam,5ul>
          (anon_struct_8_2_dd000bf7_for__M_head_impl (*array) [5])

{
  anon_struct_8_2_dd000bf7_for__M_head_impl *__cur;
  anon_struct_8_2_dd000bf7_for__M_head_impl aVar1;
  void *__dest;
  anon_struct_8_2_dd000bf7_for__M_head_impl aVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::QuantParam> PVar3;
  
  aVar1 = (anon_struct_8_2_dd000bf7_for__M_head_impl)operator_new(0x20);
  *(undefined ***)aVar1 = &PTR__ValuesInIteratorRangeGenerator_01054d68;
  *(undefined8 *)((long)aVar1 + 8) = 0;
  *(undefined8 *)((long)aVar1 + 0x10) = 0;
  *(undefined8 *)((long)aVar1 + 0x18) = 0;
  __dest = operator_new(0x28);
  *(void **)((long)aVar1 + 8) = __dest;
  *(long *)((long)aVar1 + 0x18) = (long)__dest + 0x28;
  memcpy(__dest,::(anonymous_namespace)::QuantTestParams,0x28);
  *(long *)((long)aVar1 + 0x10) = (long)__dest + 0x28;
  (*array)[0] = aVar1;
  ((anon_struct_8_2_dd000bf7_for__M_head_impl *)((long)array + 8))->min_q = 0;
  ((anon_struct_8_2_dd000bf7_for__M_head_impl *)((long)array + 8))->max_q = 0;
  aVar2 = (anon_struct_8_2_dd000bf7_for__M_head_impl)operator_new(0x18);
  *(undefined8 *)((long)aVar2 + 8) = 0x100000001;
  *(undefined ***)aVar2 = &PTR___Sp_counted_base_01054e30;
  *(anon_struct_8_2_dd000bf7_for__M_head_impl *)((long)aVar2 + 0x10) = aVar1;
  (*array)[1] = aVar2;
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::QuantParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::QuantParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::QuantParam>)
         PVar3.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::QuantParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}